

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputIBase::Setup(BasicInputIBase *this)

{
  Vector<unsigned_int,_4> local_34;
  Vector<int,_4> local_24;
  int local_14;
  BasicInputIBase *pBStack_10;
  int i;
  BasicInputIBase *this_local;
  
  this->m_po = 0;
  pBStack_10 = this;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    tcu::Vector<int,_4>::Vector(&local_24,0);
    *(undefined8 *)this->expected_datai[local_14].m_data = local_24.m_data._0_8_;
    *(undefined8 *)(this->expected_datai[local_14].m_data + 2) = local_24.m_data._8_8_;
    tcu::Vector<unsigned_int,_4>::Vector(&local_34,0);
    *(undefined8 *)this->expected_dataui[local_14].m_data = local_34.m_data._0_8_;
    *(undefined8 *)(this->expected_dataui[local_14].m_data + 2) = local_34.m_data._8_8_;
  }
  this->instance_count = 1;
  this->base_instance = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i = 0; i < 32; ++i)
		{
			expected_datai[i]  = IVec4(0);
			expected_dataui[i] = UVec4(0);
		}
		instance_count = 1;
		base_instance  = 0;
		return NO_ERROR;
	}